

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop_attribute.c
# Opt level: O0

void prf_pop_attribute_exit_f(prf_node_t *node,prf_state_t *state)

{
  long in_RSI;
  ushort *in_RDI;
  
  if (*in_RDI == prf_pop_attribute_info.opcode) {
    *(short *)(in_RSI + 0x7a) = *(short *)(in_RSI + 0x7a) + -1;
  }
  else {
    prf_error(9,"tried pop attribute exit state method on node of type %d.",(ulong)*in_RDI);
  }
  return;
}

Assistant:

static
void
prf_pop_attribute_exit_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( state != NULL && node != NULL );
    if ( node->opcode != prf_pop_attribute_info.opcode ) {
        prf_error( 9,
            "tried pop attribute exit state method on node of type %d.",
            node->opcode );
        return;
    }
    state->attribute_level--;
}